

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double i4vec_mean(int n,int *x)

{
  ulong uVar1;
  double dVar2;
  
  if (n < 1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + (double)x[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return dVar2 / (double)n;
}

Assistant:

double i4vec_mean ( int n, int x[] )

//****************************************************************************80
//
//  Purpose:
//
//    I4VEC_MEAN returns the mean of an I4VEC.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 May 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, int X[N], the vector whose mean is desired.
//
//    Output, double I4VEC_MEAN, the mean, or average, of the vector entries.
//
{
  int i;
  double mean;

  mean = 0.0;
  for ( i = 0; i < n; i++ )
  {
    mean = mean + static_cast< double > ( x[i]);
  }

  mean = mean / static_cast< double > ( n);

  return mean;
}